

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lex.c
# Opt level: O1

char * lj_lex_token2str(LexState *ls,LexToken tok)

{
  char *pcVar1;
  
  if (0x100 < tok) {
    return tokennames[tok - 0x101];
  }
  if ((""[(long)tok + 1] & 1) == 0) {
    pcVar1 = "%c";
  }
  else {
    pcVar1 = "char(%d)";
  }
  pcVar1 = lj_strfmt_pushf(ls->L,pcVar1);
  return pcVar1;
}

Assistant:

const char *lj_lex_token2str(LexState *ls, LexToken tok)
{
  if (tok > TK_OFS)
    return tokennames[tok-TK_OFS-1];
  else if (!lj_char_iscntrl(tok))
    return lj_strfmt_pushf(ls->L, "%c", tok);
  else
    return lj_strfmt_pushf(ls->L, "char(%d)", tok);
}